

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_verify(secp256k1_gej *a)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  secp256k1_gej *a_00;
  secp256k1_gej *psVar12;
  secp256k1_gej *a_01;
  secp256k1_ge *psVar13;
  secp256k1_ge *a_02;
  secp256k1_ge *a_03;
  secp256k1_ge *psVar14;
  secp256k1_gej *psVar15;
  secp256k1_gej *r;
  secp256k1_gej *a_04;
  secp256k1_ge *psVar16;
  secp256k1_ge *psVar17;
  secp256k1_ge *a_05;
  undefined1 *puVar18;
  undefined1 auVar19 [16];
  undefined1 auStack_1d8 [56];
  uint64_t uStack_1a0;
  uint64_t uStack_198;
  uint64_t uStack_190;
  uint64_t uStack_188;
  undefined8 uStack_180;
  int iStack_17c;
  secp256k1_ge *psStack_178;
  secp256k1_ge *psStack_170;
  code *pcStack_168;
  secp256k1_ge_storage sStack_160;
  secp256k1_gej *psStack_120;
  secp256k1_ge *psStack_118;
  code *pcStack_110;
  secp256k1_gej *psStack_100;
  secp256k1_gej *psStack_f8;
  secp256k1_gej *psStack_f0;
  secp256k1_gej *psStack_e0;
  undefined1 auStack_d0 [104];
  uint64_t uStack_68;
  uint64_t uStack_60;
  uint64_t uStack_58;
  uint64_t uStack_50;
  int iStack_48;
  int iStack_44;
  secp256k1_gej *psStack_40;
  
  secp256k1_fe_verify(&a->x);
  secp256k1_fe_verify(&a->y);
  psVar15 = (secp256k1_gej *)&a->z;
  secp256k1_fe_verify((secp256k1_fe *)psVar15);
  secp256k1_fe_verify_magnitude(&a->x,4);
  secp256k1_fe_verify_magnitude(&a->y,4);
  a_00 = (secp256k1_gej *)0x1;
  secp256k1_fe_verify_magnitude((secp256k1_fe *)psVar15,1);
  if ((uint)a->infinity < 2) {
    return;
  }
  secp256k1_gej_verify_cold_1();
  a_01 = (secp256k1_gej *)auStack_d0;
  a_04 = (secp256k1_gej *)auStack_d0;
  puVar18 = auStack_d0;
  psStack_40 = a;
  secp256k1_gej_verify(a_00);
  psVar15->infinity = a_00->infinity;
  secp256k1_fe_mul(&psVar15->z,&a_00->z,&a_00->y);
  secp256k1_fe_sqr((secp256k1_fe *)auStack_d0,&a_00->y);
  r = (secp256k1_gej *)(auStack_d0 + 0x60);
  psVar12 = a_00;
  secp256k1_fe_sqr((secp256k1_fe *)r,&a_00->x);
  secp256k1_fe_verify((secp256k1_fe *)r);
  if (iStack_48 < 0xb) {
    iStack_48 = iStack_48 * 3;
    psVar12 = (secp256k1_gej *)(auStack_d0 + 0x60);
    auStack_d0._96_8_ = auStack_d0._96_8_ * 3;
    uStack_68 = uStack_68 * 3;
    uStack_60 = uStack_60 * 3;
    uStack_58 = uStack_58 * 3;
    uStack_50 = uStack_50 * 3;
    iStack_44 = 0;
    secp256k1_fe_verify((secp256k1_fe *)psVar12);
    secp256k1_fe_half((secp256k1_fe *)psVar12);
    secp256k1_fe_verify((secp256k1_fe *)auStack_d0);
    secp256k1_fe_verify_magnitude((secp256k1_fe *)auStack_d0,1);
    auStack_d0._48_8_ = 0x3ffffbfffff0bc - auStack_d0._0_8_;
    auStack_d0._56_8_ = 0x3ffffffffffffc - auStack_d0._8_8_;
    r = (secp256k1_gej *)(auStack_d0 + 0x30);
    auStack_d0._64_8_ = 0x3ffffffffffffc - auStack_d0._16_8_;
    auStack_d0._72_8_ = 0x3ffffffffffffc - auStack_d0._24_8_;
    auStack_d0._80_8_ = 0x3fffffffffffc - auStack_d0._32_8_;
    auStack_d0._88_8_ = 2;
    secp256k1_fe_verify((secp256k1_fe *)r);
    secp256k1_fe_mul((secp256k1_fe *)r,(secp256k1_fe *)r,&a_00->x);
    secp256k1_fe_sqr(&psVar15->x,(secp256k1_fe *)psVar12);
    secp256k1_fe_verify(&psVar15->x);
    secp256k1_fe_verify((secp256k1_fe *)r);
    iVar5 = auStack_d0._88_4_ + (psVar15->x).magnitude;
    if (0x20 < iVar5) goto LAB_00119fe5;
    uVar2 = (psVar15->x).n[1];
    uVar3 = (psVar15->x).n[2];
    uVar4 = (psVar15->x).n[3];
    a_00 = (secp256k1_gej *)(auStack_d0 + 0x30);
    (psVar15->x).n[0] = (psVar15->x).n[0] + auStack_d0._48_8_;
    (psVar15->x).n[1] = uVar2 + auStack_d0._56_8_;
    (psVar15->x).n[2] = uVar3 + auStack_d0._64_8_;
    (psVar15->x).n[3] = uVar4 + auStack_d0._72_8_;
    puVar1 = (psVar15->x).n + 4;
    *puVar1 = *puVar1 + auStack_d0._80_8_;
    (psVar15->x).magnitude = iVar5;
    (psVar15->x).normalized = 0;
    secp256k1_fe_verify(&psVar15->x);
    secp256k1_fe_verify(&psVar15->x);
    r = a_00;
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    iVar5 = auStack_d0._88_4_ + (psVar15->x).magnitude;
    if (0x20 < iVar5) goto LAB_00119fea;
    uVar2 = (psVar15->x).n[1];
    uVar3 = (psVar15->x).n[2];
    uVar4 = (psVar15->x).n[3];
    a_00 = (secp256k1_gej *)(auStack_d0 + 0x30);
    (psVar15->x).n[0] = (psVar15->x).n[0] + auStack_d0._48_8_;
    (psVar15->x).n[1] = uVar2 + auStack_d0._56_8_;
    (psVar15->x).n[2] = uVar3 + auStack_d0._64_8_;
    (psVar15->x).n[3] = uVar4 + auStack_d0._72_8_;
    puVar1 = (psVar15->x).n + 4;
    *puVar1 = *puVar1 + auStack_d0._80_8_;
    (psVar15->x).magnitude = iVar5;
    (psVar15->x).normalized = 0;
    secp256k1_fe_verify(&psVar15->x);
    secp256k1_fe_sqr((secp256k1_fe *)auStack_d0,(secp256k1_fe *)auStack_d0);
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    r = psVar15;
    secp256k1_fe_verify(&psVar15->x);
    uVar6 = (psVar15->x).magnitude + auStack_d0._88_4_;
    if (0x20 < (int)uVar6) goto LAB_00119fef;
    a_01 = (secp256k1_gej *)(auStack_d0 + 0x30);
    auStack_d0._48_8_ = (psVar15->x).n[0] + auStack_d0._48_8_;
    auStack_d0._56_8_ = (psVar15->x).n[1] + auStack_d0._56_8_;
    auStack_d0._64_8_ = (psVar15->x).n[2] + auStack_d0._64_8_;
    auStack_d0._72_8_ = (psVar15->x).n[3] + auStack_d0._72_8_;
    auStack_d0._80_8_ = auStack_d0._80_8_ + (psVar15->x).n[4];
    auStack_d0._92_4_ = 0;
    auStack_d0._88_4_ = uVar6;
    secp256k1_fe_verify((secp256k1_fe *)a_01);
    a_00 = (secp256k1_gej *)&psVar15->y;
    secp256k1_fe_mul((secp256k1_fe *)a_00,(secp256k1_fe *)a_01,(secp256k1_fe *)(auStack_d0 + 0x60));
    secp256k1_fe_verify((secp256k1_fe *)a_00);
    secp256k1_fe_verify((secp256k1_fe *)auStack_d0);
    iVar5 = auStack_d0._40_4_ + (psVar15->y).magnitude;
    if (iVar5 < 0x21) {
      uVar2 = (psVar15->y).n[1];
      uVar3 = (psVar15->y).n[2];
      uVar4 = (psVar15->y).n[3];
      (psVar15->y).n[0] = (psVar15->y).n[0] + auStack_d0._0_8_;
      (psVar15->y).n[1] = uVar2 + auStack_d0._8_8_;
      (psVar15->y).n[2] = uVar3 + auStack_d0._16_8_;
      (psVar15->y).n[3] = uVar4 + auStack_d0._24_8_;
      puVar1 = (psVar15->y).n + 4;
      *puVar1 = *puVar1 + auStack_d0._32_8_;
      (psVar15->y).magnitude = iVar5;
      (psVar15->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      secp256k1_fe_verify_magnitude((secp256k1_fe *)a_00,2);
      uVar2 = (psVar15->y).n[1];
      uVar3 = (psVar15->y).n[2];
      uVar4 = (psVar15->y).n[3];
      (psVar15->y).n[0] = 0x5ffff9ffffe91a - (psVar15->y).n[0];
      (psVar15->y).n[1] = 0x5ffffffffffffa - uVar2;
      (psVar15->y).n[2] = 0x5ffffffffffffa - uVar3;
      (psVar15->y).n[3] = 0x5ffffffffffffa - uVar4;
      (psVar15->y).n[4] = 0x5fffffffffffa - (psVar15->y).n[4];
      (psVar15->y).magnitude = 3;
      (psVar15->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)a_00);
      secp256k1_gej_verify(psVar15);
      return;
    }
  }
  else {
    secp256k1_gej_double_cold_5();
LAB_00119fe5:
    secp256k1_gej_double_cold_4();
LAB_00119fea:
    a_01 = psVar12;
    secp256k1_gej_double_cold_3();
LAB_00119fef:
    a_04 = r;
    puVar18 = auStack_d0 + 0x60;
    secp256k1_gej_double_cold_2();
  }
  secp256k1_gej_double_cold_1();
  psStack_f0 = (secp256k1_gej *)0x11a006;
  psVar12 = a_04;
  psStack_e0 = psVar15;
  secp256k1_fe_verify(&a_04->x);
  iVar5 = (a_04->x).magnitude * (int)a_01;
  if (iVar5 < 0x21) {
    uVar7 = (ulong)a_01 & 0xffffffff;
    (a_04->x).n[0] = (a_04->x).n[0] * uVar7;
    (a_04->x).n[1] = (a_04->x).n[1] * uVar7;
    (a_04->x).n[2] = (a_04->x).n[2] * uVar7;
    (a_04->x).n[3] = (a_04->x).n[3] * uVar7;
    (a_04->x).n[4] = uVar7 * (a_04->x).n[4];
    (a_04->x).magnitude = iVar5;
    (a_04->x).normalized = 0;
    secp256k1_fe_verify(&a_04->x);
    return;
  }
  psStack_f0 = (secp256k1_gej *)secp256k1_fe_half;
  secp256k1_fe_mul_int_unchecked_cold_1();
  psStack_f8 = (secp256k1_gej *)0x11a070;
  psStack_f0 = a_04;
  secp256k1_fe_verify(&psVar12->x);
  psStack_f8 = (secp256k1_gej *)0x11a07d;
  psVar15 = psVar12;
  secp256k1_fe_verify_magnitude(&psVar12->x,0x1f);
  psVar13 = (secp256k1_ge *)(psVar12->x).n[0];
  uVar7 = -(ulong)((uint)psVar13 & 1);
  uVar9 = uVar7 >> 0xc;
  uVar11 = (long)(psVar13->x).n + (uVar9 & 0xffffefffffc2f);
  if ((uVar11 & 1) == 0) {
    uVar8 = (uVar7 >> 0x10) + (psVar12->x).n[4];
    uVar10 = uVar9 + (psVar12->x).n[3];
    uVar6 = (uint)(uVar7 >> 0x2c);
    auVar19._0_8_ = CONCAT44(uVar6,(int)uVar9);
    auVar19._8_4_ = (int)uVar9;
    auVar19._12_4_ = uVar6;
    uVar7 = auVar19._0_8_ + (psVar12->x).n[1];
    uVar9 = auVar19._8_8_ + (psVar12->x).n[2];
    (psVar12->x).n[0] = ((ulong)((uint)uVar7 & 1) << 0x33) + (uVar11 >> 1);
    (psVar12->x).n[1] = ((uVar9 & 1) << 0x33) + (uVar7 >> 1);
    (psVar12->x).n[2] = ((uVar10 & 1) << 0x33) + (uVar9 >> 1);
    (psVar12->x).n[3] = ((ulong)((uint)uVar8 & 1) << 0x33) + (uVar10 >> 1);
    (psVar12->x).n[4] = uVar8 >> 1;
    (psVar12->x).magnitude = ((psVar12->x).magnitude >> 1) + 1;
    (psVar12->x).normalized = 0;
    secp256k1_fe_verify(&psVar12->x);
    return;
  }
  psStack_f8 = (secp256k1_gej *)secp256k1_fe_add;
  secp256k1_fe_half_cold_1();
  pcStack_110 = (code *)0x11a14d;
  a_02 = psVar13;
  psStack_100 = psVar12;
  psStack_f8 = a_00;
  secp256k1_fe_verify(&psVar15->x);
  pcStack_110 = (code *)0x11a155;
  psVar16 = psVar13;
  secp256k1_fe_verify(&psVar13->x);
  iVar5 = (psVar13->x).magnitude + (psVar15->x).magnitude;
  if (iVar5 < 0x21) {
    (psVar15->x).n[0] = (psVar15->x).n[0] + (psVar13->x).n[0];
    puVar1 = (psVar15->x).n + 1;
    *puVar1 = *puVar1 + (psVar13->x).n[1];
    puVar1 = (psVar15->x).n + 2;
    *puVar1 = *puVar1 + (psVar13->x).n[2];
    puVar1 = (psVar15->x).n + 3;
    *puVar1 = *puVar1 + (psVar13->x).n[3];
    puVar1 = (psVar15->x).n + 4;
    *puVar1 = *puVar1 + (psVar13->x).n[4];
    (psVar15->x).magnitude = iVar5;
    (psVar15->x).normalized = 0;
    secp256k1_fe_verify(&psVar15->x);
    return;
  }
  pcStack_110 = secp256k1_ge_to_bytes;
  secp256k1_fe_add_cold_1();
  pcStack_168 = (code *)0x11a1bc;
  a_03 = a_02;
  psVar17 = a_02;
  psStack_120 = psVar15;
  psStack_118 = psVar13;
  pcStack_110 = (code *)puVar18;
  secp256k1_ge_verify(a_02);
  if (a_02->infinity == 0) {
    pcStack_168 = (code *)0x11a1d1;
    secp256k1_ge_to_storage(&sStack_160,a_02);
    (psVar16->y).n[0] = sStack_160.y.n[2];
    (psVar16->y).n[1] = sStack_160.y.n[3];
    (psVar16->x).n[4] = sStack_160.y.n[0];
    (psVar16->x).magnitude = (undefined4)sStack_160.y.n[1];
    (psVar16->x).normalized = sStack_160.y.n[1]._4_4_;
    (psVar16->x).n[2] = sStack_160.x.n[2];
    (psVar16->x).n[3] = sStack_160.x.n[3];
    (psVar16->x).n[0] = sStack_160.x.n[0];
    (psVar16->x).n[1] = sStack_160.x.n[1];
    return;
  }
  pcStack_168 = secp256k1_ge_to_storage;
  secp256k1_ge_to_bytes_cold_1();
  a_05 = (secp256k1_ge *)auStack_1d8;
  psVar14 = a_03;
  psVar13 = a_03;
  psStack_178 = psVar16;
  psStack_170 = a_02;
  pcStack_168 = (code *)puVar18;
  secp256k1_ge_verify(a_03);
  if (a_03->infinity == 0) {
    auStack_1d8._48_8_ = (a_03->x).n[0];
    uStack_1a0 = (a_03->x).n[1];
    uStack_198 = (a_03->x).n[2];
    uStack_190 = (a_03->x).n[3];
    uStack_188 = (a_03->x).n[4];
    uStack_180._0_4_ = (a_03->x).magnitude;
    iStack_17c = (a_03->x).normalized;
    psVar13 = (secp256k1_ge *)(auStack_1d8 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)psVar13);
    auStack_1d8._0_8_ = (a_03->y).n[0];
    auStack_1d8._8_8_ = (a_03->y).n[1];
    auStack_1d8._16_8_ = (a_03->y).n[2];
    auStack_1d8._24_8_ = (a_03->y).n[3];
    auStack_1d8._32_8_ = (a_03->y).n[4];
    auStack_1d8._40_4_ = (a_03->y).magnitude;
    auStack_1d8._44_4_ = (a_03->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_1d8);
    secp256k1_fe_verify((secp256k1_fe *)psVar13);
    if (iStack_17c != 0) {
      (psVar17->x).n[0] = uStack_1a0 << 0x34 | auStack_1d8._48_8_;
      (psVar17->x).n[1] = uStack_198 << 0x28 | uStack_1a0 >> 0xc;
      (psVar17->x).n[2] = uStack_190 << 0x1c | uStack_198 >> 0x18;
      (psVar17->x).n[3] = uStack_188 << 0x10 | uStack_190 >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_1d8);
      if (auStack_1d8._44_4_ != 0) {
        (psVar17->x).n[4] = auStack_1d8._8_8_ << 0x34 | auStack_1d8._0_8_;
        uVar7 = auStack_1d8._16_8_ << 0x28 | (ulong)auStack_1d8._8_8_ >> 0xc;
        (psVar17->x).magnitude = (int)uVar7;
        (psVar17->x).normalized = (int)(uVar7 >> 0x20);
        (psVar17->y).n[0] = auStack_1d8._24_8_ << 0x1c | (ulong)auStack_1d8._16_8_ >> 0x18;
        (psVar17->y).n[1] = auStack_1d8._32_8_ << 0x10 | (ulong)auStack_1d8._24_8_ >> 0x24;
        return;
      }
      goto LAB_0011a354;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_05 = psVar13;
  secp256k1_ge_to_storage_cold_3();
LAB_0011a354:
  secp256k1_ge_to_storage_cold_2();
  (a_05->x).n[0] = (psVar14->x).n[0] & 0xfffffffffffff;
  (a_05->x).n[1] = ((psVar14->x).n[1] & 0xffffffffff) << 0xc | (psVar14->x).n[0] >> 0x34;
  (a_05->x).n[2] = ((psVar14->x).n[2] & 0xfffffff) << 0x18 | (psVar14->x).n[1] >> 0x28;
  (a_05->x).n[3] = ((psVar14->x).n[3] & 0xffff) << 0x24 | (psVar14->x).n[2] >> 0x1c;
  (a_05->x).n[4] = (psVar14->x).n[3] >> 0x10;
  (a_05->x).magnitude = 1;
  (a_05->x).normalized = 1;
  secp256k1_fe_verify(&a_05->x);
  (a_05->y).n[0] = (psVar14->x).n[4] & 0xfffffffffffff;
  uVar7._0_4_ = (psVar14->x).magnitude;
  uVar7._4_4_ = (psVar14->x).normalized;
  (a_05->y).n[1] = (uVar7 & 0xffffffffff) << 0xc | (psVar14->x).n[4] >> 0x34;
  uVar9._0_4_ = (psVar14->x).magnitude;
  uVar9._4_4_ = (psVar14->x).normalized;
  (a_05->y).n[2] = ((psVar14->y).n[0] & 0xfffffff) << 0x18 | uVar9 >> 0x28;
  (a_05->y).n[3] = ((psVar14->y).n[1] & 0xffff) << 0x24 | (psVar14->y).n[0] >> 0x1c;
  (a_05->y).n[4] = (psVar14->y).n[1] >> 0x10;
  (a_05->y).magnitude = 1;
  (a_05->y).normalized = 1;
  secp256k1_fe_verify(&a_05->y);
  a_05->infinity = 0;
  secp256k1_ge_verify(a_05);
  return;
}

Assistant:

static void secp256k1_gej_verify(const secp256k1_gej *a) {
    SECP256K1_FE_VERIFY(&a->x);
    SECP256K1_FE_VERIFY(&a->y);
    SECP256K1_FE_VERIFY(&a->z);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->x, SECP256K1_GEJ_X_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->y, SECP256K1_GEJ_Y_MAGNITUDE_MAX);
    SECP256K1_FE_VERIFY_MAGNITUDE(&a->z, SECP256K1_GEJ_Z_MAGNITUDE_MAX);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);
    (void)a;
}